

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftpserver.c
# Opt level: O2

void uss_fstat(SftpServer *srv,SftpReplyBuilder *reply,ptrlen handle)

{
  int iVar1;
  stat *reply_00;
  stat st;
  stat sStack_98;
  
  reply_00 = &sStack_98;
  iVar1 = uss_lookup_fd((UnixSftpServer *)(srv + -6),reply,handle);
  if (-1 < iVar1) {
    iVar1 = fstat(iVar1,(stat *)&sStack_98);
    if (iVar1 < 0) {
      uss_error((UnixSftpServer *)reply,(SftpReplyBuilder *)reply_00);
      return;
    }
    uss_reply_struct_stat(reply,&sStack_98);
  }
  return;
}

Assistant:

static void uss_fstat(SftpServer *srv, SftpReplyBuilder *reply,
                      ptrlen handle)
{
    UnixSftpServer *uss = container_of(srv, UnixSftpServer, srv);
    struct stat st;
    int fd;

    if ((fd = uss_lookup_fd(uss, reply, handle)) < 0)
        return;
    int status = fstat(fd, &st);

    if (status < 0) {
        uss_error(uss, reply);
    } else {
        uss_reply_struct_stat(reply, &st);
    }
}